

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O2

char * mi_heap_strdup(mi_heap_t *heap,char *s)

{
  size_t __n;
  char *__dest;
  
  if (s != (char *)0x0) {
    __n = _mi_strlen(s);
    __dest = (char *)mi_heap_malloc(heap,__n + 1);
    if (__dest != (char *)0x0) {
      memcpy(__dest,s,__n);
      __dest[__n] = '\0';
      return __dest;
    }
  }
  return (char *)0x0;
}

Assistant:

char* mi_heap_strdup(mi_heap_t* heap, const char* s) mi_attr_noexcept {
  if (s == NULL) return NULL;
  size_t len = _mi_strlen(s);
  char* t = (char*)mi_heap_malloc(heap,len+1);
  if (t == NULL) return NULL;
  _mi_memcpy(t, s, len);
  t[len] = 0;
  return t;
}